

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_>::
runOnFunction(WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_>
              *this,Module *module,Function *func)

{
  PassRunner *pPVar1;
  Function *func_local;
  Module *module_local;
  WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_> *this_local
  ;
  
  pPVar1 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar1 != (PassRunner *)0x0) {
    Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::walkFunctionInModule
              ((Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *)
               &this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>,func
               ,module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>>::runOnFunction(Module *, Function *) [WalkerType = wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }